

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::RenderPass>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Resources *extraout_RDX;
  Resources *extraout_RDX_00;
  Resources *extraout_RDX_01;
  Resources *extraout_RDX_02;
  Unique<vk::Handle<(vk::HandleType)17>_> obj0;
  Unique<vk::Handle<(vk::HandleType)17>_> obj2;
  Unique<vk::Handle<(vk::HandleType)17>_> obj3;
  Unique<vk::Handle<(vk::HandleType)17>_> obj1;
  Environment env;
  VkRenderPass local_f8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_f0;
  Move<vk::Handle<(vk::HandleType)17>_> local_d8;
  Move<vk::Handle<(vk::HandleType)17>_> local_b8;
  Move<vk::Handle<(vk::HandleType)17>_> local_98;
  Move<vk::Handle<(vk::HandleType)17>_> local_70;
  Environment local_50;
  
  local_50.vkp = *(PlatformInterface **)(this + 8);
  local_50.vkd = Context::getDeviceInterface((Context *)this);
  local_50.device = Context::getDevice((Context *)this);
  local_50.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_50.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_50.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_50.maxResourceConsumers = 1;
  RenderPass::create(&local_98,&local_50,extraout_RDX,param_4);
  DStack_f0.m_device =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  DStack_f0.m_allocator =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  local_f8.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  DStack_f0.m_deviceIface =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  RenderPass::create(&local_d8,&local_50,extraout_RDX_00,param_4);
  local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  RenderPass::create(&local_b8,&local_50,extraout_RDX_01,param_4);
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  RenderPass::create(&local_70,&local_50,extraout_RDX_02,param_4);
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       local_70.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  if (local_70.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkRenderPass)
               local_70.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkRenderPass)
               local_d8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  if (local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkRenderPass)
               local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_f0,local_f8);
  }
  local_f8.m_internal = (deUint64)&DStack_f0.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_f8.m_internal,
             (undefined1 *)
             ((long)&(DStack_f0.m_deviceIface)->_vptr_DeviceInterface + local_f8.m_internal));
  if ((VkDevice *)local_f8.m_internal != &DStack_f0.m_device) {
    operator_delete((void *)local_f8.m_internal,(ulong)(DStack_f0.m_device + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}